

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O3

void __thiscall
Js::AsmJsVarBase::AsmJsVarBase(AsmJsVarBase *this,PropertyName name,SymbolType type,bool isMutable)

{
  SymbolType SVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  (this->super_AsmJsSymbol).mName = name;
  (this->super_AsmJsSymbol).mType = type;
  (this->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_014e8e00;
  AsmJsVarType::AsmJsVarType((AsmJsVarType *)&(this->super_AsmJsSymbol).field_0x14,Double);
  this->mLocation = 0xffffffff;
  this->mIsMutable = isMutable;
  SVar1 = (this->super_AsmJsSymbol).mType;
  if ((ConstantImport < SVar1) || (SVar1 == MathConstant)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x1af,"(AsmJsVarBase::Is(this))","AsmJsVarBase::Is(this)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

AsmJsVarBase::AsmJsVarBase(PropertyName name, AsmJsSymbol::SymbolType type, bool isMutable /*= true*/) :
        AsmJsSymbol(name, type)
        , mType(AsmJsVarType::Double)
        , mLocation(Js::Constants::NoRegister)
        , mIsMutable(isMutable)
    {
        Assert(AsmJsVarBase::Is(this));
    }